

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

int canvas_undo_disconnect(_glist *x,void *z,int action)

{
  if (action == 0) {
    freebytes(z,0x10);
  }
  else if (action == 2) {
    canvas_disconnect(x,(float)*z,(float)*(int *)((long)z + 4),(float)*(int *)((long)z + 8),
                      (float)*(int *)((long)z + 0xc));
  }
  else if (action == 1) {
    canvas_connect(x,(float)*z,(float)*(int *)((long)z + 4),(float)*(int *)((long)z + 8),
                   (float)*(int *)((long)z + 0xc));
  }
  return 1;
}

Assistant:

int canvas_undo_disconnect(t_canvas *x, void *z, int action)
{
    t_undo_connect *buf = z;
    if (action == UNDO_UNDO)
    {
        canvas_connect(x, buf->u_index1, buf->u_outletno,
            buf->u_index2, buf->u_inletno);
    }
    else if (action == UNDO_REDO)
    {
        canvas_disconnect(x, buf->u_index1, buf->u_outletno,
            buf->u_index2, buf->u_inletno);
    }
    else if (action == UNDO_FREE)
        t_freebytes(buf, sizeof(*buf));
    return 1;
}